

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O0

void __thiscall pstack::Procman::LiveProcess::stopProcess(LiveProcess *this)

{
  string *psVar1;
  undefined8 uVar2;
  char *__name;
  long lVar3;
  size_type sVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  anon_class_8_1_8991fb9c local_108;
  type_conflict1 *local_100;
  type_conflict1 *isnew;
  type *_;
  undefined1 local_e8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_e0;
  lwpid_t local_cc;
  char *pcStack_c8;
  lwpid_t tid;
  char *p;
  dirent *de;
  DIR *d;
  string local_a8 [32];
  undefined1 local_88 [8];
  string dirName;
  size_t lastStopCount;
  undefined1 local_40 [8];
  set<int,_std::less<int>,_std::allocator<int>_> suspended;
  LiveProcess *this_local;
  
  suspended._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  stop(this,this->pid);
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40,&this->pid);
  do {
    dirName.field_2._8_8_ =
         std::set<int,_std::less<int>,_std::allocator<int>_>::size
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
    psVar1 = (string *)(this->super_Process).context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a8,"task",(allocator<char> *)((long)&d + 7));
    pstack::Context::procname((int)local_88,psVar1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
    __name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88);
    de = (dirent *)opendir(__name);
    if (de != (dirent *)0x0) {
      while (p = (char *)readdir64((DIR *)de), (dirent64 *)p != (dirent64 *)0x0) {
        lVar3 = strtol(((dirent64 *)p)->d_name,&stack0xffffffffffffff38,0);
        local_cc = (lwpid_t)lVar3;
        if (*pcStack_c8 == '\0') {
          pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40,&local_cc);
          _ = (type *)pVar6.first._M_node;
          local_e8 = pVar6.second;
          local_e0.first._M_node = (_Base_ptr)_;
          local_e0.second = (bool)local_e8;
          isnew = (type_conflict1 *)std::get<0ul,std::_Rb_tree_const_iterator<int>,bool>(&local_e0);
          local_100 = std::get<1ul,std::_Rb_tree_const_iterator<int>,bool>(&local_e0);
          if ((*local_100 & 1U) != 0) {
            stop(this,local_cc);
          }
        }
      }
    }
    closedir((DIR *)de);
    uVar2 = dirName.field_2._8_8_;
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
    if ((uVar2 != sVar4) &&
       ((1 < *(int *)((this->super_Process).context + 0xa0) || (dirName.field_2._8_8_ != 1)))) {
      poVar5 = std::operator<<(*(ostream **)((this->super_Process).context + 0x78),"found ");
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4 - dirName.field_2._8_8_);
      poVar5 = std::operator<<(poVar5," new LWPs after first ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dirName.field_2._8_8_);
      std::operator<<(poVar5,"\n");
    }
    std::__cxx11::string::~string((string *)local_88);
    uVar2 = dirName.field_2._8_8_;
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  } while (uVar2 != sVar4);
  local_108.this = this;
  Process::listThreads<pstack::Procman::LiveProcess::stopProcess()::__0>
            (&this->super_Process,&local_108);
  if (1 < *(int *)((this->super_Process).context + 0xa0)) {
    poVar5 = std::operator<<(*(ostream **)((this->super_Process).context + 0x78),"stopped process ")
    ;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->pid);
    std::operator<<(poVar5,"\n");
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void
LiveProcess::stopProcess()
{
    // suspend the main process itself first.
    // XXX: Note this can actually fail if the main thread exits before the
    // remaining tasks.  Other things also fail in that case - eg, opening
    // stuff from /proc/pid/fd, etc. Really those operations should use
    // /proc/<pid>/task/<tid> of a task we have suspended, rather than the main
    // process
    std::set<lwpid_t> suspended;
    stop(pid);
    suspended.insert(pid);

    /*
     * Stop all remaining LWPs/kernel tasks. Do this before we stop the
     * threads. Stopping the threads with thread_db actually just returns an
     * error in linux, but stopping everything here ensures that we are not
     * racing the process threads to read the thread list later.
     */
    size_t lastStopCount;
    do {
        lastStopCount = suspended.size();
        std::string dirName = context.procname(pid, "task");
        DIR *d = opendir(dirName.c_str());
        if (d != nullptr) {
            for (dirent *de; (de = readdir(d)) != nullptr; ) {
                char *p;
                lwpid_t tid = strtol(de->d_name, &p, 0);
                if (*p == 0) {
                    auto [_, isnew ] = suspended.insert(tid);
                    if (isnew)
                        stop(tid);
                }
            }
        }
        closedir(d);
        // if we found any threads, log it as debug. If we went around more than once, always log.
        if (lastStopCount != suspended.size() && (context.verbose >= 2 || lastStopCount != 1))
            *context.debug << "found " << suspended.size() - lastStopCount << " new LWPs after first " << lastStopCount << "\n";
    } while (lastStopCount != suspended.size());

    /*
     * Attempt to enumerate the threads and suspend with pthread_db. This will
     * probably just fail, but all the LWPs are suspended now, anyway.
     */
    listThreads([this] (const td_thrhandle_t *thr) {
        td_thrinfo_t info;
        td_thr_get_info(thr, &info);
        int suspendError = td_thr_dbsuspend(thr);
        if (suspendError != 0 && suspendError != TD_NOCAPAB)
            *context.debug << "can't suspend thread "  << thr << ": will suspend it's LWP " << info.ti_lid << "\n";
        });

    if (context.verbose >= 2)
        *context.debug << "stopped process " << pid << "\n";
}